

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkForCustomUnit(string *unit_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  ushort uVar5;
  int iVar6;
  uint32_t uVar7;
  unit_data uVar8;
  ulong uVar9;
  size_type sVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  precise_unit pVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> csub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  pcVar3 = (unit_string->_M_dataplus)._M_p;
  lVar11 = -1;
  if (*pcVar3 == '{') {
    if (pcVar3[unit_string->_M_string_length - 1] == '}') {
      paVar1 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\'u}","");
      sVar10 = unit_string->_M_string_length - local_60._M_string_length;
      if (unit_string->_M_string_length < local_60._M_string_length || sVar10 == 0) {
        bVar12 = false;
      }
      else {
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(unit_string,sVar10,local_60._M_string_length,&local_60);
        bVar12 = iVar6 == 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (!bVar12) {
        local_60._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"index}","");
        sVar10 = unit_string->_M_string_length - local_60._M_string_length;
        if (unit_string->_M_string_length < local_60._M_string_length || sVar10 == 0)
        goto LAB_004124ab;
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(unit_string,sVar10,local_60._M_string_length,&local_60);
LAB_004124a3:
        bVar12 = iVar6 == 0;
        goto LAB_004124ad;
      }
      lVar11 = unit_string->_M_string_length - 3;
    }
  }
  else if ((*pcVar3 == '[') && (pcVar3[unit_string->_M_string_length - 1] == ']')) {
    paVar1 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"U]","");
    sVar10 = unit_string->_M_string_length - local_60._M_string_length;
    if (unit_string->_M_string_length < local_60._M_string_length || sVar10 == 0) {
      bVar12 = false;
    }
    else {
      iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(unit_string,sVar10,local_60._M_string_length,&local_60);
      bVar12 = iVar6 == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (bVar12) {
      lVar11 = unit_string->_M_string_length - 2;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"index]","");
      sVar10 = unit_string->_M_string_length - local_60._M_string_length;
      if (local_60._M_string_length <= unit_string->_M_string_length && sVar10 != 0) {
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(unit_string,sVar10,local_60._M_string_length,&local_60);
        goto LAB_004124a3;
      }
LAB_004124ab:
      bVar12 = false;
LAB_004124ad:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (bVar12) {
        lVar11 = unit_string->_M_string_length - 6;
        bVar12 = true;
        goto LAB_004124d8;
      }
    }
  }
  bVar12 = false;
LAB_004124d8:
  if (lVar11 == -1) {
    uVar9 = 0xfa94a488;
    dVar13 = NAN;
  }
  else {
    cVar2 = (unit_string->_M_dataplus)._M_p[lVar11 + -1];
    if ((cVar2 == '_') || (cVar2 == '\'')) {
      lVar11 = lVar11 + -1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_60,unit_string,1,lVar11 - 1);
    sVar10 = local_60._M_string_length;
    _Var4._M_p = local_60._M_dataplus._M_p;
    if (bVar12) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      uVar7 = getCommodity(&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      uVar9 = (ulong)uVar7 << 0x20 | 0x51800;
    }
    else {
      if (local_60._M_string_length != 0) {
        uVar9 = 0;
        do {
          iVar6 = tolower((int)_Var4._M_p[uVar9]);
          _Var4._M_p[uVar9] = (char)iVar6;
          uVar9 = uVar9 + 1;
        } while (sVar10 != uVar9);
      }
      uVar5 = std::_Hash_bytes(local_60._M_dataplus._M_p,local_60._M_string_length,0xc70f6907);
      uVar8 = precise::custom::custom_unit(uVar5 & 0x3f);
      uVar9 = (ulong)(uint)uVar8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    dVar13 = 1.0;
  }
  pVar14.base_units_ = (unit_data)(int)uVar9;
  pVar14.commodity_ = (int)(uVar9 >> 0x20);
  pVar14.multiplier_ = dVar13;
  return pVar14;
}

Assistant:

static precise_unit checkForCustomUnit(const std::string& unit_string)
{
    size_t loc = std::string::npos;
    bool index = false;
    if (unit_string.front() == '[' && unit_string.back() == ']') {
        if (ends_with(unit_string, "U]")) {
            loc = unit_string.size() - 2;
        } else if (ends_with(unit_string, "index]")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    } else if (unit_string.front() == '{' && unit_string.back() == '}') {
        if (ends_with(unit_string, "'u}")) {
            loc = unit_string.size() - 3;
        } else if (ends_with(unit_string, "index}")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    }
    if (loc != std::string::npos) {
        if ((unit_string[loc - 1] == '\'') || (unit_string[loc - 1] == '_')) {
            --loc;
        }
        auto csub = unit_string.substr(1, loc - 1);

        if (index) {
            auto hcode = getCommodity(csub);
            return {1.0, precise::generate_custom_count_unit(0), hcode};
        }

        std::transform(csub.begin(), csub.end(), csub.begin(), ::tolower);
        auto custcode = std::hash<std::string>{}(csub);
        return precise::generate_custom_unit(custcode & 0x3FU);
    }

    return precise::invalid;
}